

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O0

void __thiscall ipx::SparseMatrix::add_column(SparseMatrix *this)

{
  Int IVar1;
  iterator __first;
  iterator __result;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *in_RDI;
  Int nznew;
  Int nz;
  undefined4 in_stack_ffffffffffffff88;
  Int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffa8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffb8;
  
  IVar1 = entries((SparseMatrix *)0x84d1a8);
  queue_size((SparseMatrix *)0x84d1be);
  reserve((SparseMatrix *)CONCAT44(IVar1,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI,
             CONCAT44(IVar1,in_stack_ffffffffffffff90));
  std::
  copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  __first = std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  __result = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  _Var2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator+(in_RDI,CONCAT44(IVar1,in_stack_ffffffffffffff90));
  _Var2 = std::
          copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    (__first._M_current,_Var2,__result._M_current);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)_Var2._M_current,(value_type_conflict2 *)in_RDI);
  clear_queue((SparseMatrix *)CONCAT44(IVar1,in_stack_ffffffffffffff90));
  return;
}

Assistant:

void SparseMatrix::add_column() {
    Int nz = entries();
    Int nznew = nz + queue_size();
    reserve(nznew);
    std::copy(rowidx_queue_.begin(), rowidx_queue_.end(), rowidx_.begin() + nz);
    std::copy(values_queue_.begin(), values_queue_.end(), values_.begin() + nz);
    colptr_.push_back(nznew);
    clear_queue();
}